

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::RigidBody(RigidBody *this)

{
  StuntDouble::StuntDouble(&this->super_StuntDouble,otRigidBody,0x1c0);
  (this->super_StuntDouble)._vptr_StuntDouble = (_func_int **)&PTR__RigidBody_0022d630;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]
       = 0.0;
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]
       = 0.0;
  memset(&this->sU_,0,0xa8);
  return;
}

Assistant:

RigidBody::RigidBody() :
      StuntDouble(otRigidBody, &Snapshot::rigidbodyData), inertiaTensor_(0.0) {}